

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O1

void bench_scalar_inverse_var(void *arg,int iters)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  ulong uVar15;
  ulong uVar17;
  undefined1 auVar16 [16];
  
  pvVar6 = (void *)(ulong)(uint)iters;
  if (iters < 1) {
    iVar4 = 0;
    pvVar7 = arg;
  }
  else {
    iVar4 = 0;
    iVar8 = iters;
    do {
      secp256k1_scalar_inverse_var((secp256k1_scalar *)arg,(secp256k1_scalar *)arg);
      pvVar6 = arg;
      pvVar7 = arg;
      iVar1 = secp256k1_scalar_add
                        ((secp256k1_scalar *)arg,(secp256k1_scalar *)arg,
                         (secp256k1_scalar *)((long)arg + 0x20));
      iVar4 = iVar4 + iVar1;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  if (iters < iVar4) {
    bench_scalar_inverse_var_cold_1();
    if (0 < (int)pvVar6) {
      lVar11 = *(long *)((long)pvVar7 + 0x40);
      lVar12 = *(long *)((long)pvVar7 + 0x48);
      lVar9 = *(long *)((long)pvVar7 + 0x50);
      lVar10 = *(long *)((long)pvVar7 + 0x58);
      uVar2 = *(ulong *)((long)pvVar7 + 0x60);
      do {
        uVar3 = -(ulong)((uint)lVar11 & 1);
        uVar2 = uVar2 + (uVar3 >> 0x10);
        auVar14._8_4_ = (int)uVar3;
        auVar14._0_8_ = uVar3;
        auVar14._12_4_ = (int)(uVar3 >> 0x20);
        uVar13 = (uVar3 >> 0xc) + lVar9;
        uVar15 = (auVar14._8_8_ >> 0xc) + lVar10;
        uVar17 = (uVar3 >> 0xc) + lVar12;
        auVar16._8_4_ = (int)uVar13;
        auVar16._0_8_ = uVar17;
        auVar16._12_4_ = (int)(uVar13 >> 0x20);
        lVar11 = ((uVar17 & 1) << 0x33) + ((uVar3 >> 0xc & 0xffffefffffc2f) + lVar11 >> 1);
        lVar12 = ((auVar16._8_8_ & 1) << 0x33) + (uVar17 >> 1);
        lVar9 = ((uVar15 & 1) << 0x33) + (uVar13 >> 1);
        lVar10 = ((uVar2 & 1) << 0x33) + (uVar15 >> 1);
        uVar2 = uVar2 >> 1;
        uVar5 = (int)pvVar6 - 1;
        pvVar6 = (void *)(ulong)uVar5;
      } while (uVar5 != 0);
      *(long *)((long)pvVar7 + 0x40) = lVar11;
      *(long *)((long)pvVar7 + 0x48) = lVar12;
      *(long *)((long)pvVar7 + 0x50) = lVar9;
      *(long *)((long)pvVar7 + 0x58) = lVar10;
      *(ulong *)((long)pvVar7 + 0x60) = uVar2;
    }
    return;
  }
  return;
}

Assistant:

static void bench_scalar_inverse_var(void* arg, int iters) {
    int i, j = 0;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        secp256k1_scalar_inverse_var(&data->scalar[0], &data->scalar[0]);
        j += secp256k1_scalar_add(&data->scalar[0], &data->scalar[0], &data->scalar[1]);
    }
    CHECK(j <= iters);
}